

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O3

int cuddAnnealing(DdManager *table,int lower,int upper)

{
  uint uVar1;
  DdHalfWord x_low;
  int iVar2;
  uint uVar3;
  DdHalfWord x_high;
  DdHalfWord y;
  DdHalfWord x;
  int iVar4;
  DdHalfWord DVar5;
  void *__dest;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  DdHalfWord DVar17;
  int iVar18;
  DdHalfWord y_00;
  DdHalfWord DVar19;
  ulong uVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  double __x;
  int local_ac;
  
  iVar2 = cuddSifting(table,lower,upper);
  if (iVar2 == 0) {
    return 0;
  }
  uVar3 = (upper - lower) + 1;
  uVar1 = table->keys;
  iVar2 = table->isolated;
  __dest = malloc((long)(int)uVar3 << 2);
  if (__dest == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    return 0;
  }
  iVar2 = uVar1 - iVar2;
  lVar13 = (long)lower;
  if (lower <= upper) {
    memcpy(__dest,table->invperm + lVar13,(ulong)uVar3 << 2);
  }
  local_ac = uVar3 * 0xf;
  uVar20 = (ulong)((upper - lower) + 1);
  __x = (double)iVar2 * 0.6;
  iVar21 = iVar2 + 10;
  iVar14 = iVar2 + 0x14;
  iVar12 = iVar2 + 0x1e;
  iVar15 = iVar2;
  iVar16 = iVar2;
  while ((iVar18 = iVar15, iVar15 = iVar12, dVar23 = __x, 1.0 < dVar23 ||
         (iVar21 != iVar15 || (iVar21 != iVar18 || iVar21 != iVar14)))) {
    if (0 < local_ac) {
      iVar21 = 0;
LAB_007c46f2:
      uVar6 = Cudd_Random();
      do {
        uVar7 = Cudd_Random();
        iVar12 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                      (long)(int)uVar3);
        iVar2 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
                     (long)(int)uVar3);
      } while (iVar12 == iVar2);
      x_high = iVar12 + lower;
      x_low = iVar2 + lower;
      if (iVar12 <= iVar2) {
        x_low = x_high;
        x_high = iVar2 + lower;
      }
      lVar8 = Cudd_Random();
      if ((double)lVar8 / 2147483561.0 < 0.4) {
        y = cuddNextHigh(table,x_low);
        x = cuddNextLow(table,x_high);
        iVar12 = table->keys - table->isolated;
        pDVar10 = (DdNode *)0x0;
        iVar2 = iVar12;
        DVar19 = x_low;
        DVar17 = x_high;
        do {
          y_00 = DVar17;
          DVar5 = y;
          if (y == x) {
            iVar4 = cuddSwapInPlace(table,DVar19,y);
            if ((iVar4 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
            goto LAB_007c4b83;
            pDVar9->index = DVar19;
            pDVar9->ref = y;
            *(int *)((long)&pDVar9->next + 4) = iVar4;
            (pDVar9->type).kids.T = pDVar10;
            iVar4 = cuddSwapInPlace(table,y,y_00);
            if ((iVar4 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
            goto LAB_007c4b9c;
            pDVar10->index = y;
            pDVar10->ref = y_00;
            *(int *)((long)&pDVar10->next + 4) = iVar4;
            (pDVar10->type).kids.T = pDVar9;
            iVar4 = cuddSwapInPlace(table,DVar19,y);
            pDVar9 = pDVar10;
            if ((iVar4 == 0) || (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
            goto LAB_007c4b9c;
            pDVar11->index = DVar19;
            DVar17 = DVar19;
          }
          else {
            DVar17 = x;
            if (DVar19 == x) {
              iVar4 = cuddSwapInPlace(table,x,y);
              if ((iVar4 == 0) || (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
              {
LAB_007c4b83:
                pDVar9 = pDVar10;
                if (pDVar10 != (DdNode *)0x0) goto LAB_007c4b9c;
                goto LAB_007c4bc6;
              }
              pDVar11->index = x;
            }
            else {
              iVar4 = cuddSwapInPlace(table,DVar19,y);
              if ((iVar4 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
              goto LAB_007c4b83;
              pDVar9->index = DVar19;
              pDVar9->ref = y;
              *(int *)((long)&pDVar9->next + 4) = iVar4;
              (pDVar9->type).kids.T = pDVar10;
              iVar4 = cuddSwapInPlace(table,x,y_00);
              if ((iVar4 == 0) || (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
              goto LAB_007c4b9c;
              pDVar11->index = x;
              pDVar10 = pDVar9;
              DVar5 = y_00;
              y_00 = y;
            }
          }
          pDVar11->ref = DVar5;
          *(int *)((long)&pDVar11->next + 4) = iVar4;
          (pDVar11->type).kids.T = pDVar10;
          y = cuddNextHigh(table,y_00);
          x = cuddNextLow(table,DVar17);
          if (((int)x_high < (int)y) || ((double)iVar2 * 1.1 < (double)iVar4)) goto LAB_007c49d6;
          pDVar10 = pDVar11;
          DVar19 = y_00;
          if (iVar4 < iVar2) {
            iVar2 = iVar4;
          }
        } while( true );
      }
      DVar19 = x_low;
      if ((double)lVar8 / 2147483561.0 < 0.76) {
        DVar19 = x_high;
      }
      iVar2 = ddJumpingAux(table,DVar19,x_low,x_high,dVar23);
      if (iVar2 != 0) goto LAB_007c4a80;
      goto LAB_007c4bc6;
    }
LAB_007c4af7:
    __x = dVar23 * 0.9;
    iVar21 = iVar14;
    iVar14 = iVar18;
    iVar12 = iVar2;
    if (1.0 <= __x) {
      dVar22 = log(__x);
      dVar23 = log(dVar23);
      local_ac = (int)((double)local_ac * (dVar22 / dVar23));
    }
  }
  if (lower <= upper) {
    uVar6 = 0;
    do {
      iVar2 = table->perm[*(int *)((long)__dest + uVar6 * 4)];
      iVar21 = cuddNextLow(table,iVar2);
      while (iVar14 = iVar21, (long)(uVar6 + lVar13) <= (long)iVar14) {
        iVar2 = cuddSwapInPlace(table,iVar14,iVar2);
        if (iVar2 == 0) goto LAB_007c4bc6;
        iVar21 = cuddNextLow(table,iVar14);
        iVar2 = iVar14;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar20);
  }
  free(__dest);
  return 1;
LAB_007c49d6:
  if ((int)x_low <= (int)x) {
    iVar2 = cuddSwapInPlace(table,x,DVar17);
    pDVar9 = pDVar11;
    if ((iVar2 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
    goto LAB_007c4b9c;
    pDVar10->index = x;
    pDVar10->ref = DVar17;
    *(int *)((long)&pDVar10->next + 4) = iVar2;
    (pDVar10->type).kids.T = pDVar11;
    pDVar11 = pDVar10;
  }
  iVar2 = siftBackwardProb(table,(Move *)pDVar11,iVar12,dVar23);
  pDVar9 = pDVar11;
  if (iVar2 != 0) {
    pDVar10 = table->nextFree;
    do {
      pDVar9 = pDVar11;
      pDVar11 = (pDVar9->type).kids.T;
      pDVar9->ref = 0;
      pDVar9->next = pDVar10;
      pDVar10 = pDVar9;
    } while (pDVar11 != (DdNode *)0x0);
    table->nextFree = pDVar9;
LAB_007c4a80:
    iVar2 = table->keys - table->isolated;
    iVar12 = iVar16;
    if (iVar2 < iVar16) {
      iVar12 = iVar2;
    }
    if ((lower <= upper) && (iVar2 < iVar16)) {
      memcpy(__dest,table->invperm + lVar13,uVar20 * 4);
      iVar12 = iVar2;
    }
    iVar16 = iVar12;
    iVar21 = iVar21 + 1;
    if (iVar21 == local_ac) goto LAB_007c4af7;
    goto LAB_007c46f2;
  }
LAB_007c4b9c:
  pDVar10 = table->nextFree;
  do {
    pDVar11 = pDVar9;
    pDVar9 = (pDVar11->type).kids.T;
    pDVar11->ref = 0;
    pDVar11->next = pDVar10;
    pDVar10 = pDVar11;
  } while (pDVar9 != (DdNode *)0x0);
  table->nextFree = pDVar11;
LAB_007c4bc6:
  free(__dest);
  return 0;
}

Assistant:

int
cuddAnnealing(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         nvars;
    int         size;
    int         x,y;
    int         result;
    int         c1, c2, c3, c4;
    int         BestCost;
    int         *BestOrder;
    double      NewTemp, temp;
    double      rand1;
    int         innerloop, maxGen;
    int         ecount, ucount, dcount;
   
    nvars = upper - lower + 1;

    result = cuddSifting(table,lower,upper);
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    if (result == 0) return(0);

    size = table->keys - table->isolated;

    /* Keep track of the best order. */
    BestCost = size;
    BestOrder = ABC_ALLOC(int,nvars);
    if (BestOrder == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    copyOrder(table,BestOrder,lower,upper);

    temp = BETA * size;
    maxGen = (int) (MAXGEN_RATIO * nvars);

    c1 = size + 10;
    c2 = c1 + 10;
    c3 = size;
    c4 = c2 + 10;
    ecount = ucount = dcount = 0;
 
    while (!stopping_criterion(c1, c2, c3, c4, temp)) {
#ifdef DD_STATS
        (void) fprintf(table->out,"temp=%f\tsize=%d\tgen=%d\t",
                       temp,size,maxGen);
        tosses = acceptances = 0;
#endif
        for (innerloop = 0; innerloop < maxGen; innerloop++) {
            /* Choose x, y  randomly. */
            x = (int) Cudd_Random() % nvars;
            do {
                y = (int) Cudd_Random() % nvars;
            } while (x == y);
            x += lower;
            y += lower;
            if (x > y) {
                int tmp = x;
                x = y;
                y = tmp;
            }

            /* Choose move with roulette wheel. */
            rand1 = random_generator();
            if (rand1 < EXC_PROB) {
                result = ddExchange(table,x,y,temp);       /* exchange */
                ecount++;
#if 0
                (void) fprintf(table->out,
                               "Exchange of %d and %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            } else if (rand1 < EXC_PROB + JUMP_UP_PROB) {
                result = ddJumpingAux(table,y,x,y,temp); /* jumping_up */
                ucount++;
#if 0
                (void) fprintf(table->out,
                               "Jump up of %d to %d: size = %d\n",
                               y,x,table->keys - table->isolated);
#endif
            } else {
                result = ddJumpingAux(table,x,x,y,temp); /* jumping_down */
                dcount++;
#if 0
                (void) fprintf(table->out,
                               "Jump down of %d to %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            }

            if (!result) {
                ABC_FREE(BestOrder);
                return(0);
            }

            size = table->keys - table->isolated;       /* keep current size */
            if (size < BestCost) {                      /* update best order */
                BestCost = size;
                copyOrder(table,BestOrder,lower,upper);
            }
        }
        c1 = c2;
        c2 = c3;
        c3 = c4;
        c4 = size;
        NewTemp = ALPHA * temp;
        if (NewTemp >= 1.0) {
            maxGen = (int)(log(NewTemp) / log(temp) * maxGen);
        }
        temp = NewTemp;                 /* control variable */
#ifdef DD_STATS
        (void) fprintf(table->out,"uphill = %d\taccepted = %d\n",
                       tosses,acceptances);
        fflush(table->out);
#endif
    }

    result = restoreOrder(table,BestOrder,lower,upper);
    ABC_FREE(BestOrder);
    if (!result) return(0);
#ifdef DD_STATS
    fprintf(table->out,"#:N_EXCHANGE %8d : total exchanges\n",ecount);
    fprintf(table->out,"#:N_JUMPUP   %8d : total jumps up\n",ucount);
    fprintf(table->out,"#:N_JUMPDOWN %8d : total jumps down",dcount);
#endif
    return(1);

}